

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

Address * __thiscall
ot::commissioner::UdpSocket::GetLocalAddr(Address *__return_storage_ptr__,UdpSocket *this)

{
  int iVar1;
  socklen_t len;
  sockaddr_storage addr;
  socklen_t local_c4;
  undefined1 local_c0 [40];
  sockaddr_storage local_98;
  
  local_c4 = 0x80;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = getsockname(*(int *)&(this->super_Socket).field_0xb4,(sockaddr *)&local_98,&local_c4);
  if (iVar1 == 0) {
    Address::Set((Error *)local_c0,__return_storage_ptr__,&local_98);
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    if (local_c0._0_4_ == kNone) {
      return __return_storage_ptr__;
    }
  }
  abort();
}

Assistant:

Address UdpSocket::GetLocalAddr() const
{
    sockaddr_storage addr;
    socklen_t        len = sizeof(sockaddr_storage);
    Address          ret;

    VerifyOrDie(getsockname(mNetCtx.fd, reinterpret_cast<sockaddr *>(&addr), &len) == 0);
    SuccessOrDie(ret.Set(addr));
    return ret;
}